

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimerPre.h
# Opt level: O0

void __thiscall HTimerPre::reset(HTimerPre *this)

{
  HTimerPre *in_RDI;
  double dVar1;
  HTimerPre *unaff_retaddr;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < 0xe; local_c = local_c + 1) {
    in_RDI->itemTicks[local_c] = 0.0;
  }
  dVar1 = getWallTime(unaff_retaddr);
  in_RDI->startTime = dVar1;
  dVar1 = getWallTick(in_RDI);
  in_RDI->startTick = dVar1;
  return;
}

Assistant:

void reset() {
        for (int i = 0; i < HTICK_ITEMS_COUNT_PRE; i++)
            itemTicks[i] = 0;
        startTime = getWallTime();
        startTick = getWallTick();
    }